

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folded_integer_bit_encoder.h
# Opt level: O0

void __thiscall
draco::FoldedBit32Encoder<draco::RAnsBitEncoder>::EncodeLeastSignificantBits32
          (FoldedBit32Encoder<draco::RAnsBitEncoder> *this,int nbits,uint32_t value)

{
  uint in_EDX;
  int in_ESI;
  size_type in_RDI;
  undefined1 uVar1;
  bool bit;
  int i;
  uint32_t selector;
  undefined7 in_stack_ffffffffffffffe0;
  undefined4 local_18;
  undefined4 local_14;
  
  local_14 = 1 << ((char)in_ESI - 1U & 0x1f);
  for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
    uVar1 = (in_EDX & local_14) != 0;
    std::array<draco::RAnsBitEncoder,_32UL>::operator[]
              ((array<draco::RAnsBitEncoder,_32UL> *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),
               in_RDI);
    RAnsBitEncoder::EncodeBit
              ((RAnsBitEncoder *)CONCAT17(uVar1,in_stack_ffffffffffffffe0),SUB81(in_RDI >> 0x38,0));
    local_14 = local_14 >> 1;
  }
  return;
}

Assistant:

void EncodeLeastSignificantBits32(int nbits, uint32_t value) {
    uint32_t selector = 1 << (nbits - 1);
    for (int i = 0; i < nbits; i++) {
      const bool bit = (value & selector);
      folded_number_encoders_[i].EncodeBit(bit);
      selector = selector >> 1;
    }
  }